

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O0

void amrex::MultiFab::AddProduct
               (MultiFab *dst,MultiFab *src1,int comp1,MultiFab *src2,int comp2,int dstcomp,
               int numcomp,IntVect *nghost)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  int in_EDX;
  MFIter *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<double> dfab;
  Array4<const_double> s2fab;
  Array4<const_double> s1fab;
  Box *bx;
  MFIter mfi;
  int in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  int iVar4;
  int local_2b0;
  int local_2ac;
  undefined1 in_stack_fffffffffffffd67;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  IntVect *in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  int local_248;
  int local_244;
  int local_240;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  int local_208;
  int local_204;
  int local_200;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  Box local_1a4;
  Box *local_188;
  MFIter local_180;
  int local_120;
  int local_11c;
  int local_10c;
  IntVect *local_f8;
  int local_f0;
  Box *local_e8;
  int local_dc;
  int iStack_d8;
  int local_d4;
  undefined8 local_d0;
  int local_c8;
  Box *local_c0;
  int local_b4;
  int iStack_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  long *local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  long *local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  long *local_68;
  undefined4 local_5c;
  IntVect *local_58;
  undefined4 local_4c;
  IntVect *local_48;
  undefined4 local_3c;
  IntVect *local_38;
  undefined4 local_2c;
  Box *local_28;
  undefined4 local_1c;
  Box *local_18;
  undefined4 local_c;
  Box *local_8;
  
  local_120 = in_R9D;
  local_11c = in_R8D;
  local_10c = in_EDX;
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                 (bool)in_stack_fffffffffffffd67);
  while (bVar2 = MFIter::isValid(&local_180), bVar2) {
    MFIter::growntilebox
              ((MFIter *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               in_stack_fffffffffffffd78);
    local_188 = &local_1a4;
    bVar2 = Box::ok(local_188);
    if (bVar2) {
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),in_RDI);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),in_RDI);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),in_RDI);
      local_e8 = local_188;
      local_8 = local_188;
      local_c = 0;
      local_dc = (local_188->smallend).vect[0];
      local_18 = local_188;
      local_1c = 1;
      iStack_d8 = (local_188->smallend).vect[1];
      in_stack_fffffffffffffd78 = *(IntVect **)(local_188->smallend).vect;
      local_28 = local_188;
      local_2c = 2;
      in_stack_fffffffffffffd80 = (local_188->smallend).vect[2];
      local_c0 = local_188;
      local_38 = &local_188->bigend;
      local_3c = 0;
      local_b4 = local_38->vect[0];
      local_48 = &local_188->bigend;
      local_4c = 1;
      iStack_b0 = (local_188->bigend).vect[1];
      local_d0 = *(undefined8 *)local_38->vect;
      local_58 = &local_188->bigend;
      local_5c = 2;
      local_c8 = (local_188->bigend).vect[2];
      for (local_2ac = 0; local_2b0 = in_stack_fffffffffffffd80,
          local_f8 = in_stack_fffffffffffffd78, local_f0 = in_stack_fffffffffffffd80,
          local_d4 = in_stack_fffffffffffffd80, local_ac = local_c8, local_2ac < in_stack_00000008;
          local_2ac = local_2ac + 1) {
        for (; iVar4 = iStack_d8, local_2b0 <= local_c8; local_2b0 = local_2b0 + 1) {
          for (; iVar1 = local_dc, iVar4 <= iStack_b0; iVar4 = iVar4 + 1) {
            while (in_stack_fffffffffffffd48 = iVar1, in_stack_fffffffffffffd48 <= local_b4) {
              local_8c = local_2b0;
              local_90 = local_2ac + local_10c;
              local_80 = &local_1e8;
              local_a4 = local_2b0;
              local_a8 = local_2ac + local_11c;
              local_98 = &local_228;
              local_74 = local_2b0;
              local_78 = local_2ac + local_120;
              local_68 = &local_268;
              lVar3 = (long)(in_stack_fffffffffffffd48 - local_248) +
                      (iVar4 - local_244) * local_260 + (local_2b0 - local_240) * local_258 +
                      local_78 * local_250;
              *(double *)(local_268 + lVar3 * 8) =
                   *(double *)
                    (local_1e8 +
                    ((long)(in_stack_fffffffffffffd48 - local_1c8) + (iVar4 - local_1c4) * local_1e0
                     + (local_2b0 - local_1c0) * local_1d8 + local_90 * local_1d0) * 8) *
                   *(double *)
                    (local_228 +
                    ((long)(in_stack_fffffffffffffd48 - local_208) + (iVar4 - local_204) * local_220
                     + (local_2b0 - local_200) * local_218 + local_a8 * local_210) * 8) +
                   *(double *)(local_268 + lVar3 * 8);
              local_a0 = iVar4;
              local_9c = in_stack_fffffffffffffd48;
              local_88 = iVar4;
              local_84 = in_stack_fffffffffffffd48;
              local_70 = iVar4;
              local_6c = in_stack_fffffffffffffd48;
              iVar1 = in_stack_fffffffffffffd48 + 1;
            }
          }
          in_stack_fffffffffffffd4c = iVar4;
        }
      }
    }
    MFIter::operator++(&local_180);
  }
  MFIter::~MFIter(in_RDI);
  return;
}

Assistant:

void
MultiFab::AddProduct (MultiFab& dst,
                      const MultiFab& src1, int comp1,
                      const MultiFab& src2, int comp2,
                      int dstcomp, int numcomp, const IntVect& nghost)
{
    BL_ASSERT(dst.boxArray() == src1.boxArray());
    BL_ASSERT(dst.distributionMap == src1.distributionMap);
    BL_ASSERT(dst.boxArray() == src2.boxArray());
    BL_ASSERT(dst.distributionMap == src2.distributionMap);
    BL_ASSERT(dst.nGrowVect().allGE(nghost) && src1.nGrowVect().allGE(nghost) && src2.nGrowVect().allGE(nghost));

    BL_PROFILE("MultiFab::AddProduct()");

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& dstma = dst.arrays();
        auto const& src1ma = src1.const_arrays();
        auto const& src2ma = src2.const_arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstma[box_no](i,j,k,n+dstcomp) += src1ma[box_no](i,j,k,n+comp1)
                *                             src2ma[box_no](i,j,k,n+comp2);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);
            if (bx.ok()) {
                auto const s1fab = src1.array(mfi);
                auto const s2fab = src2.array(mfi);
                auto        dfab =  dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dfab(i,j,k,n+dstcomp) += s1fab(i,j,k,n+comp1) * s2fab(i,j,k,n+comp2);
                });
            }
        }
    }
}